

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool __thiscall
tinyobj::ObjReader::ParseFromString
          (ObjReader *this,string *obj_text,string *mtl_text,ObjReaderConfig *config)

{
  ObjReader OVar1;
  _Ios_Openmode _Var2;
  undefined1 local_348 [8];
  MaterialStreamReader mtl_ss;
  istream mtl_ifs;
  istream local_220 [8];
  istream obj_ifs;
  stringbuf local_f8 [8];
  stringbuf mtl_buf;
  stringbuf local_90 [8];
  stringbuf obj_buf;
  ObjReaderConfig *config_local;
  string *mtl_text_local;
  string *obj_text_local;
  ObjReader *this_local;
  
  _Var2 = std::operator|(_S_in,_S_out);
  std::__cxx11::stringbuf::stringbuf(local_90,(string *)obj_text,_Var2);
  _Var2 = std::operator|(_S_in,_S_out);
  std::__cxx11::stringbuf::stringbuf(local_f8,(string *)mtl_text,_Var2);
  std::istream::istream(local_220,(streambuf *)local_90);
  std::istream::istream(&mtl_ss.m_inStream,(streambuf *)local_f8);
  MaterialStreamReader::MaterialStreamReader
            ((MaterialStreamReader *)local_348,(istream *)&mtl_ss.m_inStream);
  OVar1 = (ObjReader)
          LoadObj((attrib_t *)(this + 8),
                  (vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)(this + 0x98),
                  (vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)(this + 0xb0)
                  ,(string *)(this + 200),(string *)(this + 0xe8),local_220,
                  (MaterialReader *)local_348,(bool)((byte)*config & 1),(bool)((byte)config[1] & 1))
  ;
  *this = OVar1;
  OVar1 = *this;
  MaterialStreamReader::~MaterialStreamReader((MaterialStreamReader *)local_348);
  std::istream::~istream(&mtl_ss.m_inStream);
  std::istream::~istream(local_220);
  std::__cxx11::stringbuf::~stringbuf(local_f8);
  std::__cxx11::stringbuf::~stringbuf(local_90);
  return (bool)((byte)OVar1 & 1);
}

Assistant:

bool ObjReader::ParseFromString(const std::string &obj_text,
                                const std::string &mtl_text,
                                const ObjReaderConfig &config) {
  std::stringbuf obj_buf(obj_text);
  std::stringbuf mtl_buf(mtl_text);

  std::istream obj_ifs(&obj_buf);
  std::istream mtl_ifs(&mtl_buf);

  MaterialStreamReader mtl_ss(mtl_ifs);

  valid_ = LoadObj(&attrib_, &shapes_, &materials_, &warning_, &error_,
                   &obj_ifs, &mtl_ss, config.triangulate, config.vertex_color);

  return valid_;
}